

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,char8_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,int count,char8_t *value)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0;
  if (0 < count) {
    iVar1 = count;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    buffer<char8_t>::push_back(out.container,value);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}